

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::do_insert(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
           unsigned_long *value,time_point now,time_point expire_time)

{
  long lVar1;
  _List_iterator<unsigned_long> _Var2;
  long lVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar4;
  unsigned_long element_idx;
  
  if ((ulong)((*(long *)(this + 0x40) - *(long *)(this + 0x38)) / 0x28) <= *(ulong *)(this + 0x30))
  {
    do_prune(this,now);
  }
  element_idx = *(unsigned_long *)(*(long *)(this + 0xb8) + 0x10);
  pVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,unsigned_long&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)(this + 0x50),key,&element_idx);
  std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((list<unsigned_long,std::allocator<unsigned_long>> *)(this + 0xa0),&element_idx);
  lVar1 = *(long *)(this + 0x38);
  lVar3 = element_idx * 0x28;
  *(unsigned_long *)(lVar1 + 0x20 + lVar3) = *value;
  ((duration *)(lVar1 + lVar3))->__r = (rep)expire_time.__d.__r;
  *(undefined8 *)(lVar1 + 0x10 + lVar3) = *(undefined8 *)(this + 0xb8);
  _Var2 = std::prev<std::_List_iterator<unsigned_long>>((_List_node_base *)(this + 0xa0),1);
  *(_List_node_base **)(lVar1 + 0x18 + lVar3) = _Var2._M_node;
  ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
    *)(lVar1 + 8 + lVar3))->_M_cur =
       (__node_type *)
       pVar4.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
       ._M_cur;
  *(undefined8 *)(this + 0xb8) = **(undefined8 **)(this + 0xb8);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  do_access(this,(element *)(lVar1 + lVar3));
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }
        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        m_ttl_list.emplace_back(element_idx);

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = std::prev(m_ttl_list.end());
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }